

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::MessageBuilder::MessageBuilder
          (MessageBuilder *this,StringRef macroName,SourceLineInfo *lineInfo,OfType type)

{
  OfType type_local;
  SourceLineInfo *lineInfo_local;
  MessageBuilder *this_local;
  StringRef macroName_local;
  
  MessageStream::MessageStream(&this->super_MessageStream);
  MessageInfo::MessageInfo(&this->m_info,macroName,lineInfo,type);
  return;
}

Assistant:

MessageBuilder( StringRef macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type ):
            m_info(macroName, lineInfo, type) {}